

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::VerifyLinkItemColons(cmGeneratorTarget *this,LinkItemRole role,cmLinkItem *item)

{
  bool bVar1;
  bool bVar2;
  PolicyStatus PVar3;
  string *psVar4;
  long lVar5;
  cmake *this_00;
  PolicyID id;
  MessageType t;
  string_view str;
  string_view prefix;
  string e;
  cmListFileBacktrace backtrace;
  undefined1 local_98 [48];
  string local_68;
  string local_48;
  
  bVar2 = true;
  if (item->Target == (cmGeneratorTarget *)0x0) {
    psVar4 = cmLinkItem::AsStr_abi_cxx11_(item);
    str._M_str = (psVar4->_M_dataplus)._M_p;
    str._M_len = psVar4->_M_string_length;
    prefix._M_str = "<LINK_GROUP:";
    prefix._M_len = 0xc;
    bVar1 = cmHasPrefix(str,prefix);
    if (!bVar1) {
      psVar4 = cmLinkItem::AsStr_abi_cxx11_(item);
      lVar5 = std::__cxx11::string::find((char *)psVar4,0x692a06);
      if (lVar5 != -1) {
        e._M_dataplus._M_p = (pointer)&e.field_2;
        e._M_string_length = 0;
        e.field_2._M_local_buf[0] = '\0';
        PVar3 = cmLocalGenerator::GetPolicyStatus(this->LocalGenerator,CMP0028);
        if (PVar3 == OLD) {
          bVar2 = true;
        }
        else {
          if (PVar3 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_48,(cmPolicies *)0x1c,id);
            backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_48._M_string_length;
            backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_dataplus._M_p;
            local_98._0_8_ = &DAT_00000001;
            local_98._8_8_ = "\n";
            cmStrCat<>(&local_68,(cmAlphaNum *)&backtrace,(cmAlphaNum *)local_98);
            std::__cxx11::string::operator=((string *)&e,(string *)&local_68);
            std::__cxx11::string::~string((string *)&local_68);
            std::__cxx11::string::~string((string *)&local_48);
            t = AUTHOR_WARNING;
          }
          else {
            t = FATAL_ERROR;
          }
          if (role == Implementation) {
            backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)e._M_string_length;
            backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)e._M_dataplus._M_p;
            local_98._0_8_ = (element_type *)0x8;
            local_98._8_8_ = "Target \"";
            psVar4 = GetName_abi_cxx11_(this);
            cmStrCat<std::__cxx11::string,char[11]>
                      (&local_68,(cmAlphaNum *)&backtrace,(cmAlphaNum *)local_98,psVar4,
                       (char (*) [11])"\" links to");
          }
          else {
            backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)e._M_string_length;
            backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)e._M_dataplus._M_p;
            local_98._0_8_ = &DAT_0000001e;
            local_98._8_8_ = "The link interface of target \"";
            psVar4 = GetName_abi_cxx11_(this);
            cmStrCat<std::__cxx11::string,char[11]>
                      (&local_68,(cmAlphaNum *)&backtrace,(cmAlphaNum *)local_98,psVar4,
                       (char (*) [11])"\" contains");
          }
          std::__cxx11::string::operator=((string *)&e,(string *)&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)e._M_string_length;
          backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)e._M_dataplus._M_p;
          local_98._0_8_ = (element_type *)0x4;
          local_98._8_8_ = ":\n  ";
          psVar4 = cmLinkItem::AsStr_abi_cxx11_(item);
          cmStrCat<std::__cxx11::string,char[2],char[32],std::basic_string_view<char,std::char_traits<char>>>
                    (&local_68,(cmAlphaNum *)&backtrace,(cmAlphaNum *)local_98,psVar4,
                     (char (*) [2])0x670b54,(char (*) [32])"but the target was not found.  ",
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     (anonymous_namespace)::missingTargetPossibleReasons);
          std::__cxx11::string::operator=((string *)&e,(string *)&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          std::
          __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)&backtrace,
                         (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)&item->Backtrace);
          bVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&backtrace);
          if (bVar2) {
            GetBacktrace((cmGeneratorTarget *)local_98);
            std::
            __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         *)&backtrace,
                        (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         *)local_98);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
          }
          this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          cmake::IssueMessage(this_00,t,&e,&backtrace);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&e);
      }
    }
  }
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::VerifyLinkItemColons(LinkItemRole role,
                                             cmLinkItem const& item) const
{
  if (item.Target || cmHasPrefix(item.AsStr(), "<LINK_GROUP:"_s) ||
      item.AsStr().find("::") == std::string::npos) {
    return true;
  }
  MessageType messageType = MessageType::FATAL_ERROR;
  std::string e;
  switch (this->GetLocalGenerator()->GetPolicyStatus(cmPolicies::CMP0028)) {
    case cmPolicies::WARN: {
      e = cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0028), "\n");
      messageType = MessageType::AUTHOR_WARNING;
    } break;
    case cmPolicies::OLD:
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Issue the fatal message.
      break;
  }

  if (role == LinkItemRole::Implementation) {
    e = cmStrCat(e, "Target \"", this->GetName(), "\" links to");
  } else {
    e = cmStrCat(e, "The link interface of target \"", this->GetName(),
                 "\" contains");
  }
  e =
    cmStrCat(e, ":\n  ", item.AsStr(), "\n", "but the target was not found.  ",
             missingTargetPossibleReasons);
  cmListFileBacktrace backtrace = item.Backtrace;
  if (backtrace.Empty()) {
    backtrace = this->GetBacktrace();
  }
  this->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(messageType, e,
                                                              backtrace);
  return false;
}